

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsSocket.cpp
# Opt level: O0

bool __thiscall Scs::Socket::Bind(Socket *this,addrinfo *addr)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  int lastError;
  int result;
  addrinfo *addr_local;
  Socket *this_local;
  
  iVar2 = bind(this->m_socket,(sockaddr *)addr->ai_addr,addr->ai_addrlen);
  puVar3 = (uint *)__errno_location();
  uVar1 = *puVar3;
  if ((((iVar2 == -1) && (uVar1 != 0xb)) && (uVar1 != 0xb)) && (uVar1 != 0x73)) {
    LogWriteLine("Bind failed with error: %d",(ulong)uVar1);
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Socket::Bind(addrinfo * addr)
{
	// Setup the TCP listening socket
	int result = bind(m_socket, addr->ai_addr, (int)addr->ai_addrlen);
	int lastError = SocketLastError;
	if (result == SOCKET_ERROR && lastError != SCS_EWOULDBLOCK && lastError != EAGAIN && lastError != SCS_EINPROGRESS)
	{
		LogWriteLine("Bind failed with error: %d", lastError);
		return false;
	}
	return true;
}